

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O3

void __thiscall
kratos::DebugDatabase::set_break_points(DebugDatabase *this,Generator *top,string *ext)

{
  void *pvVar1;
  long lVar2;
  long *plVar3;
  pointer pcVar4;
  pointer ppVar5;
  undefined1 auVar6 [8];
  int iVar7;
  undefined1 filename [8];
  long *plVar8;
  undefined1 local_c0 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  fn_ln;
  Stmt *stmt;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_88;
  undefined1 local_58 [8];
  string fn_ext;
  
  extract_debug_break_points
            ((vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_> *)&local_88,top);
  pvVar1 = *(void **)this;
  lVar2 = *(long *)(this + 0x10);
  *(pointer *)this = local_88.first._M_dataplus._M_p;
  *(size_type *)(this + 8) = local_88.first._M_string_length;
  *(size_type *)(this + 0x10) = local_88.first.field_2._M_allocated_capacity;
  local_88.first._M_dataplus._M_p = (pointer)0x0;
  local_88.first._M_string_length = 0;
  local_88.first.field_2._M_allocated_capacity = 0;
  if ((pvVar1 != (void *)0x0) &&
     (operator_delete(pvVar1,lVar2 - (long)pvVar1),
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)local_88.first._M_dataplus._M_p !=
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)0x0)) {
    operator_delete(local_88.first._M_dataplus._M_p,
                    local_88.first.field_2._M_allocated_capacity -
                    (long)local_88.first._M_dataplus._M_p);
  }
  plVar8 = *(long **)this;
  plVar3 = *(long **)(this + 8);
  fn_ext.field_2._8_8_ = this;
  if (plVar8 != plVar3) {
    do {
      fn_ln.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar8;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                *)local_c0,
               (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                *)&((fn_ln.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->first)._M_string_length);
      ppVar5 = fn_ln.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (filename = local_c0; filename != (undefined1  [8])ppVar5;
          filename = (undefined1  [8])((long)filename + 0x28)) {
        fs::get_ext((string *)local_58,(string *)filename);
        auVar6 = local_58;
        if ((fn_ext._M_dataplus._M_p == (pointer)ext->_M_string_length) &&
           ((fn_ext._M_dataplus._M_p == (pointer)0x0 ||
            (iVar7 = bcmp((void *)local_58,(ext->_M_dataplus)._M_p,(size_t)fn_ext._M_dataplus._M_p),
            iVar7 == 0)))) {
          local_88.first._M_dataplus._M_p = (pointer)&local_88.first.field_2;
          pcVar4 = (((pointer)filename)->first)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_88,pcVar4,
                     pcVar4 + (((pointer)filename)->first)._M_string_length);
          local_88.second = ((pointer)filename)->second;
          std::
          _Rb_tree<kratos::Stmt_const*,std::pair<kratos::Stmt_const*const,std::pair<std::__cxx11::string,unsigned_int>>,std::_Select1st<std::pair<kratos::Stmt_const*const,std::pair<std::__cxx11::string,unsigned_int>>>,std::less<kratos::Stmt_const*>,std::allocator<std::pair<kratos::Stmt_const*const,std::pair<std::__cxx11::string,unsigned_int>>>>
          ::_M_emplace_unique<kratos::Stmt_const*&,std::pair<std::__cxx11::string,unsigned_int>>
                    ((_Rb_tree<kratos::Stmt_const*,std::pair<kratos::Stmt_const*const,std::pair<std::__cxx11::string,unsigned_int>>,std::_Select1st<std::pair<kratos::Stmt_const*const,std::pair<std::__cxx11::string,unsigned_int>>>,std::less<kratos::Stmt_const*>,std::allocator<std::pair<kratos::Stmt_const*const,std::pair<std::__cxx11::string,unsigned_int>>>>
                      *)(this + 0x18),
                     (Stmt **)&fn_ln.
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88.first._M_dataplus._M_p != &local_88.first.field_2) {
            operator_delete(local_88.first._M_dataplus._M_p,
                            local_88.first.field_2._M_allocated_capacity + 1);
          }
          if (local_58 != (undefined1  [8])&fn_ext._M_string_length) {
            operator_delete((void *)local_58,fn_ext._M_string_length + 1);
          }
          break;
        }
        if (auVar6 != (undefined1  [8])&fn_ext._M_string_length) {
          operator_delete((void *)auVar6,fn_ext._M_string_length + 1);
        }
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 *)local_c0);
      plVar8 = plVar8 + 1;
    } while (plVar8 != plVar3);
  }
  compute_generators((DebugDatabase *)fn_ext.field_2._8_8_,top);
  return;
}

Assistant:

void DebugDatabase::set_break_points(Generator *top, const std::string &ext) {
    // set the break points
    break_points_ = extract_debug_break_points(top);

    // index all the front-end code
    // we are only interested in the files that has the extension
    for (auto const *stmt : break_points_) {
        auto fn_ln = stmt->fn_name_ln;
        for (auto const &[fn, ln] : fn_ln) {
            auto fn_ext = fs::get_ext(fn);
            if (fn_ext == ext) {
                // this is the one we need
                stmt_mapping_.emplace(stmt, std::make_pair(fn, ln));
                break;
            }
        }
    }
    // set generators
    compute_generators(top);
}